

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab2njd.c
# Opt level: O1

void mecab2njd(NJD *njd,char **feature,int size)

{
  NJDNode *node;
  ulong uVar1;
  
  if (0 < size) {
    uVar1 = 0;
    do {
      node = (NJDNode *)calloc(1,0x78);
      NJDNode_initialize(node);
      NJDNode_load(node,feature[uVar1]);
      NJD_push_node(njd,node);
      uVar1 = uVar1 + 1;
    } while ((uint)size != uVar1);
  }
  return;
}

Assistant:

void mecab2njd(NJD * njd, char **feature, int size)
{
   int i;
   NJDNode *node;

   for (i = 0; i < size; i++) {
      node = (NJDNode *) calloc(1, sizeof(NJDNode));
      NJDNode_initialize(node);
      NJDNode_load(node, feature[i]);
      NJD_push_node(njd, node);
   }
}